

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::Vertex::Le(Vertex *this,
                vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *infiniteLights,
                Vertex *v,SampledWavelengths *lambda)

{
  array<float,_4> aVar1;
  bool bVar2;
  Vertex *this_00;
  undefined8 in_RSI;
  Ray *in_RDI;
  float fVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar16 [60];
  undefined1 auVar14 [64];
  undefined1 auVar17 [56];
  undefined1 auVar15 [64];
  Point3f PVar18;
  Vector3<float> VVar19;
  SampledSpectrum SVar20;
  LightHandle *light;
  const_iterator __end3;
  const_iterator __begin3;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range3;
  Vector3f w;
  SampledSpectrum Le;
  undefined4 in_stack_fffffffffffffe68;
  Float in_stack_fffffffffffffe6c;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffe70;
  Point3<float> *in_stack_fffffffffffffe78;
  SampledSpectrum *s;
  Vertex *in_stack_fffffffffffffe80;
  Ray *ray;
  SampledSpectrum local_148;
  float local_138;
  float local_130 [2];
  float local_128;
  undefined8 local_120;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  Vector3f *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Normal3f *in_stack_ffffffffffffff00;
  Point3f *in_stack_ffffffffffffff08;
  LightHandle *in_stack_ffffffffffffff10;
  __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
  local_b8;
  undefined8 local_b0;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Tuple3<pbrt::Vector3,_float> local_94;
  Tuple3<pbrt::Vector3,_float> local_88;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  Tuple3<pbrt::Vector3,_float> local_3c [2];
  undefined8 local_20;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar13 [56];
  
  auVar13 = in_ZMM0._8_56_;
  local_20 = in_RSI;
  bVar2 = IsLight(in_stack_fffffffffffffe80);
  if (bVar2) {
    PVar18 = p(in_stack_fffffffffffffe80);
    local_50 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
    auVar4._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar4._8_56_ = auVar13;
    local_58 = vmovlpd_avx(auVar4._0_16_);
    local_48 = local_58;
    local_40 = local_50;
    PVar18 = p(in_stack_fffffffffffffe80);
    local_70 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
    auVar5._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar5._8_56_ = auVar13;
    local_78 = vmovlpd_avx(auVar5._0_16_);
    local_68 = local_78;
    local_60 = local_70;
    VVar19 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_88.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar13;
    local_88._0_8_ = vmovlpd_avx(auVar6._0_16_);
    local_3c[0]._0_8_ = local_88._0_8_;
    local_3c[0].z = local_88.z;
    fVar3 = LengthSquared<float>((Vector3<float> *)local_3c);
    auVar16 = SUB6460(ZEXT1664((undefined1  [16])0x0),4);
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      auVar13 = extraout_var;
      VVar19 = Normalize<float>((Vector3<float> *)in_RDI);
      auVar14._0_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar14._4_60_ = auVar16;
      auVar7._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar7._8_56_ = auVar13;
      local_a8._0_8_ = vmovlpd_avx(auVar7._0_16_);
      local_a8.z = auVar14._0_4_;
      local_94._0_8_ = local_a8._0_8_;
      local_94.z = auVar14._0_4_;
      local_3c[0]._0_8_ = local_a8._0_8_;
      local_3c[0].z = auVar14._0_4_;
      bVar2 = IsInfiniteLight(in_stack_fffffffffffffe80);
      auVar17 = auVar14._8_56_;
      if (bVar2) {
        auVar8 = ZEXT1664((undefined1  [16])0x0);
        SampledSpectrum::SampledSpectrum
                  ((SampledSpectrum *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        local_b0 = local_20;
        local_b8._M_current =
             (LightHandle *)
             std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::begin
                       ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::end
                  ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        while( true ) {
          auVar17 = auVar14._8_56_;
          auVar13 = auVar8._8_56_;
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                              *)in_stack_fffffffffffffe70,
                             (__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                              *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          if (!bVar2) break;
          this_00 = (Vertex *)
                    __gnu_cxx::
                    __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                    ::operator*(&local_b8);
          PVar18 = p(this_00);
          auVar9._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar9._8_56_ = auVar13;
          local_120 = vmovlpd_avx(auVar9._0_16_);
          VVar19 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffe70);
          local_138 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar10._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar10._8_56_ = auVar13;
          local_148.values.values._8_8_ = vmovlpd_avx(auVar10._0_16_);
          s = &local_148;
          local_130 = (float  [2])local_148.values.values._8_8_;
          local_128 = local_138;
          MediumHandle::TaggedPointer
                    ((MediumHandle *)in_stack_fffffffffffffe70,
                     (nullptr_t)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          ray = (Ray *)&stack0xffffffffffffff00;
          auVar13 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
          Ray::Ray(in_RDI,(Point3f *)ray,(Vector3f *)this_00,(Float)((ulong)s >> 0x20),
                   (MediumHandle *)in_stack_fffffffffffffe70);
          SVar20 = LightHandle::Le((LightHandle *)in_RDI,ray,(SampledWavelengths *)this_00);
          auVar14._0_8_ = SVar20.values.values._8_8_;
          auVar14._8_56_ = auVar17;
          auVar8._0_8_ = SVar20.values.values._0_8_;
          auVar8._8_56_ = auVar13;
          vmovlpd_avx(auVar8._0_16_);
          vmovlpd_avx(auVar14._0_16_);
          SampledSpectrum::operator+=((SampledSpectrum *)this_00,s);
          __gnu_cxx::
          __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
          ::operator++(&local_b8);
        }
      }
      else {
        bVar2 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)&in_RDI[5].time);
        if (bVar2) {
          PVar18 = Interaction::p((Interaction *)&in_RDI[5].time);
          auVar11._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar11._8_56_ = auVar13;
          vmovlpd_avx(auVar11._0_16_);
          SVar20 = LightHandle::L(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                                  in_stack_ffffffffffffff00,
                                  (Point2f *)
                                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                  in_stack_fffffffffffffef0,
                                  (SampledWavelengths *)
                                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          auVar15._0_8_ = SVar20.values.values._8_8_;
          auVar15._8_56_ = auVar17;
          auVar12._0_8_ = SVar20.values.values._0_8_;
          auVar12._8_56_ = auVar13;
          local_10 = vmovlpd_avx(auVar12._0_16_);
          local_8 = vmovlpd_avx(auVar15._0_16_);
        }
        else {
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        }
      }
    }
    else {
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    }
  }
  else {
    SampledSpectrum::SampledSpectrum
              ((SampledSpectrum *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  }
  aVar1.values[2] = (float)(undefined4)local_8;
  aVar1.values[3] = (float)local_8._4_4_;
  aVar1.values[0] = (float)(undefined4)local_10;
  aVar1.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

SampledSpectrum Le(const std::vector<LightHandle> &infiniteLights, const Vertex &v,
                       const SampledWavelengths &lambda) const {
        if (!IsLight())
            return SampledSpectrum(0.f);
        Vector3f w = v.p() - p();
        if (LengthSquared(w) == 0)
            return SampledSpectrum(0.);
        w = Normalize(w);
        if (IsInfiniteLight()) {
            // Return emitted radiance for infinite light sources
            SampledSpectrum Le(0.f);
            for (const auto &light : infiniteLights)
                Le += light.Le(Ray(p(), -w), lambda);
            return Le;

        } else {
            return si.areaLight ? si.areaLight.L(si.p(), si.n, si.uv, w, lambda)
                                : SampledSpectrum(0.);
        }
    }